

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::postscriptStmt
          (Parser *this,
          unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *baseStmt)

{
  Stmt *this_00;
  bool bVar1;
  LiteralType args;
  SourceLocation *pSVar2;
  pointer pEVar3;
  FilePos *endPos;
  unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *in_RDX;
  undefined1 local_c0 [31];
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_7e [6];
  undefined1 local_78 [2];
  Opcode opc;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> condExpr;
  undefined1 local_60 [8];
  SourceLocation sloc;
  Token op;
  unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *baseStmt_local;
  Parser *this_local;
  
  sloc.end.offset = token((Parser *)baseStmt);
  if ((sloc.end.offset != If) && (sloc.end.offset != Unless)) {
    std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::unique_ptr
              ((unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)this,in_RDX);
    return (unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>)this;
  }
  pSVar2 = location((Parser *)baseStmt);
  SourceLocation::SourceLocation((SourceLocation *)local_60,pSVar2);
  nextToken((Parser *)baseStmt);
  expr((Parser *)local_78);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_78);
  if (bVar1) {
    if (sloc.end.offset == 0x3d) {
      pEVar3 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::get
                         ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                          local_78);
      local_7e._0_2_ = makeOperator(Not,pEVar3);
      if (local_7e._0_2_ == EXIT) {
        this_00 = baseStmt[0xd]._M_t.
                  super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>
                  .super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
        pSVar2 = lastLocation((Parser *)baseStmt);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,
                   "Type cast error. No cast implementation found for requested cast from {} to {}."
                   ,&local_a1);
        pEVar3 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::
                 operator->((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                            local_78);
        args = (*(pEVar3->super_ASTNode)._vptr_ASTNode[3])();
        diagnostics::Report::typeError<flow::LiteralType,flow::LiteralType>
                  ((Report *)this_00,pSVar2,&local_a0,args,Boolean);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator(&local_a1);
        std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
        unique_ptr<std::default_delete<flow::lang::Stmt>,void>
                  ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                   (nullptr_t)0x0);
        goto LAB_0015d1e9;
      }
      std::
      make_unique<flow::lang::UnaryExpr,flow::Opcode&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,flow::SourceLocation&>
                ((Opcode *)(local_c0 + 0x10),
                 (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_7e,
                 (SourceLocation *)local_78);
      std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::operator=
                ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)local_78,
                 (unique_ptr<flow::lang::UnaryExpr,_std::default_delete<flow::lang::UnaryExpr>_> *)
                 (local_c0 + 0x10));
      std::unique_ptr<flow::lang::UnaryExpr,_std::default_delete<flow::lang::UnaryExpr>_>::
      ~unique_ptr((unique_ptr<flow::lang::UnaryExpr,_std::default_delete<flow::lang::UnaryExpr>_> *)
                  (local_c0 + 0x10));
    }
    bVar1 = consume((Parser *)baseStmt,Semicolon);
    if (bVar1) {
      local_c0._0_8_ = 0;
      endPos = end((Parser *)baseStmt);
      SourceLocation::update((SourceLocation *)local_60,endPos);
      std::
      make_unique<flow::lang::CondStmt,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>,decltype(nullptr),flow::SourceLocation&>
                ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                 (local_c0 + 8),
                 (unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)local_78,
                 (void **)in_RDX,(SourceLocation *)local_c0);
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
      unique_ptr<flow::lang::CondStmt,std::default_delete<flow::lang::CondStmt>,void>
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                 (unique_ptr<flow::lang::CondStmt,_std::default_delete<flow::lang::CondStmt>_> *)
                 (local_c0 + 8));
      std::unique_ptr<flow::lang::CondStmt,_std::default_delete<flow::lang::CondStmt>_>::~unique_ptr
                ((unique_ptr<flow::lang::CondStmt,_std::default_delete<flow::lang::CondStmt>_> *)
                 (local_c0 + 8));
    }
    else {
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
      unique_ptr<std::default_delete<flow::lang::Stmt>,void>
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                 (nullptr_t)0x0);
    }
  }
  else {
    std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
    unique_ptr<std::default_delete<flow::lang::Stmt>,void>
              ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
               (nullptr_t)0x0);
  }
LAB_0015d1e9:
  local_7e._2_4_ = 1;
  std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
            ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_78);
  SourceLocation::~SourceLocation((SourceLocation *)local_60);
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::postscriptStmt(
    std::unique_ptr<Stmt> baseStmt) {
  Token op = token();
  switch (op) {
    case Token::If:
    case Token::Unless:
      break;
    default:
      return baseStmt;
  }

  // STMT ['if' EXPR] ';'
  // STMT ['unless' EXPR] ';'

  SourceLocation sloc = location();

  nextToken();  // 'if' | 'unless'

  std::unique_ptr<Expr> condExpr = expr();
  if (!condExpr) return nullptr;

  if (op == Token::Unless) {
    auto opc = makeOperator(Token::Not, condExpr.get());
    if (opc == Opcode::EXIT) {
      report_.typeError(
          lastLocation(),
          "Type cast error. No cast implementation found for requested cast "
          "from {} to {}.",
          condExpr->getType(), LiteralType::Boolean);
      return nullptr;
    }

    condExpr = std::make_unique<UnaryExpr>(opc, std::move(condExpr), sloc);
  }

  if (!consume(Token::Semicolon)) return nullptr;

  return std::make_unique<CondStmt>(std::move(condExpr), std::move(baseStmt),
                                    nullptr, sloc.update(end()));
}